

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O2

void Cec_ManSimFindBestPattern(Cec_ManSim_t *p)

{
  int iVar1;
  ulong uVar2;
  void *pvVar3;
  ulong uVar4;
  Gia_Man_t *pGVar5;
  ulong uVar6;
  Abc_Cex_t *pAVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  
  uVar4 = 0;
  uVar2 = (ulong)(uint)(p->nWords << 5);
  if (p->nWords << 5 < 1) {
    uVar2 = uVar4;
  }
  uVar6 = 1;
  iVar9 = 0;
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    iVar1 = p->pScores[uVar4];
    iVar10 = iVar9;
    if (iVar9 <= iVar1) {
      iVar10 = iVar1;
    }
    if (iVar9 < iVar1) {
      uVar6 = uVar4;
    }
    uVar6 = uVar6 & 0xffffffff;
    iVar9 = iVar10;
  }
  pAVar7 = p->pBestState;
  if (pAVar7->iPo <= iVar9) {
    iVar1 = pAVar7->nRegs;
    pGVar5 = p->pAig;
    if (iVar1 != pGVar5->nRegs) {
      __assert_fail("p->pBestState->nRegs == Gia_ManRegNum(p->pAig)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecClass.c"
                    ,0x232,"void Cec_ManSimFindBestPattern(Cec_ManSim_t *)");
    }
    for (uVar8 = 0; (int)uVar8 < iVar1; uVar8 = uVar8 + 1) {
      pvVar3 = Vec_PtrEntry(p->vCiSimInfo,(pGVar5->vCis->nSize - iVar1) + uVar8);
      pAVar7 = p->pBestState;
      if (((*(uint *)((long)pvVar3 + (long)((int)uVar6 >> 5) * 4) >> ((byte)uVar6 & 0x1f) ^
           (uint)(&pAVar7[1].iPo)[uVar8 >> 5] >> (sbyte)(uVar8 & 0x1f)) & 1) != 0) {
        (&pAVar7[1].iPo)[uVar8 >> 5] = (&pAVar7[1].iPo)[uVar8 >> 5] ^ 1 << (uVar8 & 0x1f);
      }
      pGVar5 = p->pAig;
      iVar1 = pGVar5->nRegs;
    }
    pAVar7->iPo = iVar9;
  }
  return;
}

Assistant:

void Cec_ManSimFindBestPattern( Cec_ManSim_t * p )
{ 
    unsigned * pInfo;
    int i, ScoreBest = 0, iPatBest = 1; // set the first pattern
    // find the best pattern
    for ( i = 0; i < 32 * p->nWords; i++ )
        if ( ScoreBest < p->pScores[i] )
        {
            ScoreBest = p->pScores[i];
            iPatBest = i;
        }
    // compare this with the available patterns - and save
    if ( p->pBestState->iPo <= ScoreBest )
    {
        assert( p->pBestState->nRegs == Gia_ManRegNum(p->pAig) );
        for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
        {
            pInfo = (unsigned *)Vec_PtrEntry( p->vCiSimInfo, Gia_ManPiNum(p->pAig) + i );
            if ( Abc_InfoHasBit(p->pBestState->pData, i) != Abc_InfoHasBit(pInfo, iPatBest) )
                Abc_InfoXorBit( p->pBestState->pData, i );
        }
        p->pBestState->iPo = ScoreBest;
    }
}